

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

void Llb_Nonlin4SweepPrint(Vec_Ptr_t *vFuncs)

{
  uint uVar1;
  DdNode *node;
  int i;
  
  printf("(%d) ",(ulong)(uint)vFuncs->nSize);
  for (i = 0; i < vFuncs->nSize; i = i + 1) {
    node = (DdNode *)Vec_PtrEntry(vFuncs,i);
    uVar1 = Cudd_DagSize(node);
    printf("%d ",(ulong)uVar1);
  }
  putchar(10);
  return;
}

Assistant:

void Llb_Nonlin4SweepPrint( Vec_Ptr_t * vFuncs )
{
    DdNode * bFunc;
    int i;
    printf( "(%d) ", Vec_PtrSize(vFuncs) );
    Vec_PtrForEachEntry( DdNode *, vFuncs, bFunc, i )
        printf( "%d ", Cudd_DagSize(bFunc) );
    printf( "\n" );
}